

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::ServiceDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  ulong uVar3;
  void *pvVar4;
  Nonnull<const_char_*> pcVar5;
  Arena *arena;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::MethodDescriptorProto>);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        pp_Var2 = from_msg[3]._vptr_MessageLite;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 3),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
                   arena);
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((ServiceDescriptorProto *)&stack0xffffffffffffffd0);
          goto LAB_0025b53d;
        }
        to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar4 = Arena::CopyConstruct<google::protobuf::ServiceOptions>(arena_00,from_msg_00);
          to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
        }
        else {
          ServiceOptions::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar3 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar3 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_0025b53d:
  MergeImpl();
}

Assistant:

void ServiceDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ServiceDescriptorProto*>(&to_msg);
  auto& from = static_cast<const ServiceDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_method()->MergeFrom(
      from._internal_method());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}